

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,char *value)

{
  int32 iVar1;
  int iVar2;
  size_t sVar3;
  char *in_RDX;
  IMkvWriter *in_RSI;
  undefined8 *in_RDI;
  uint64 length;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RDX == (char *)0x0)) {
    bVar4 = false;
  }
  else {
    iVar1 = WriteID((IMkvWriter *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                    (uint64)in_RDI);
    if (iVar1 == 0) {
      sVar3 = strlen(in_RDX);
      iVar1 = WriteUInt(in_RSI,(uint64)in_RDX);
      if (iVar1 == 0) {
        iVar2 = (**(code **)*in_RDI)(in_RDI,in_RDX,sVar3 & 0xffffffff);
        if (iVar2 == 0) {
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
      }
      else {
        bVar4 = false;
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, const char* value) {
  if (!writer || !value)
    return false;

  if (WriteID(writer, type))
    return false;

  const uint64 length = strlen(value);
  if (WriteUInt(writer, length))
    return false;

  if (writer->Write(value, static_cast<uint32>(length)))
    return false;

  return true;
}